

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

void __thiscall
Centaurus::CATNMachine<char>::CATNMachine(CATNMachine<char> *this,ATNMachine<char> *atn)

{
  allocator_type local_2d;
  value_type_conflict local_2c;
  vector<int,_std::allocator<int>_> node_map;
  
  this->_vptr_CATNMachine = (_func_int **)&PTR__CATNMachine_00197c60;
  (this->m_nodes).
  super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&node_map,
             (long)(int)(((long)(atn->m_nodes).
                                super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(atn->m_nodes).
                               super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x98),&local_2c,
             &local_2d);
  import_atn_node(this,atn,0,-1,&node_map,0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&node_map.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

CATNMachine(const ATNMachine<TCHAR>& atn)
    {
        std::vector<int> node_map(atn.get_node_num(), -1);

        import_atn_node(atn, 0, -1, node_map, 0);
    }